

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeBlock
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name label,Signature sig)

{
  Block *curr;
  MixedArena *this_00;
  
  this_00 = &this->wasm->allocator;
  curr = (Block *)MixedArena::allocSpace(this_00,0x40,8);
  (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
  (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  (curr->name).super_IString.str._M_len = 0;
  (curr->name).super_IString.str._M_str = (char *)0x0;
  (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (curr->list).allocator = this_00;
  (curr->name).super_IString.str._M_len = label.super_IString.str._M_len;
  (curr->name).super_IString.str._M_str = label.super_IString.str._M_str;
  (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
       sig.results.id.id;
  visitBlockStart(__return_storage_ptr__,this,curr,sig.params.id);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeBlock(Name label, Signature sig) {
  auto* block = wasm.allocator.alloc<Block>();
  block->name = label;
  block->type = sig.results;
  return visitBlockStart(block, sig.params);
}